

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_filename.c
# Opt level: O0

int64_t file_seek(archive *a,void *client_data,int64_t request,wchar_t whence)

{
  int *piVar1;
  wchar_t seek_bits;
  int64_t r;
  off_t seek;
  read_file_data *mine;
  wchar_t whence_local;
  int64_t request_local;
  void *client_data_local;
  archive *a_local;
  
  a_local = (archive *)lseek(*client_data,request,whence);
  if ((long)a_local < 0) {
    if (*(int *)((long)client_data + 0x2c) == 0) {
      piVar1 = __errno_location();
      archive_set_error(a,*piVar1,"Error seeking in stdin");
    }
    else if (*(int *)((long)client_data + 0x2c) == 1) {
      piVar1 = __errno_location();
      archive_set_error(a,*piVar1,"Error seeking in \'%s\'",(long)client_data + 0x30);
    }
    else {
      piVar1 = __errno_location();
      archive_set_error(a,*piVar1,"Error seeking in \'%ls\'",(long)client_data + 0x30);
    }
    a_local = (archive *)0xffffffffffffffe2;
  }
  return (int64_t)a_local;
}

Assistant:

static int64_t
file_seek(struct archive *a, void *client_data, int64_t request, int whence)
{
	struct read_file_data *mine = (struct read_file_data *)client_data;
	off_t seek = (off_t)request;
	int64_t r;
	int seek_bits = sizeof(seek) * 8 - 1;

	/* We use off_t here because lseek() is declared that way. */

	/* Reduce a request that would overflow the 'seek' variable. */
	if (sizeof(request) > sizeof(seek)) {
		const int64_t max_seek =
		    (((int64_t)1 << (seek_bits - 1)) - 1) * 2 + 1;
		const int64_t min_seek = ~max_seek;
		if (request > max_seek)
			seek = (off_t)max_seek;
		else if (request < min_seek)
			seek = (off_t)min_seek;
	}

	r = lseek(mine->fd, seek, whence);
	if (r >= 0)
		return r;

	/* If the input is corrupted or truncated, fail. */
	if (mine->filename_type == FNT_STDIN)
		archive_set_error(a, errno, "Error seeking in stdin");
	else if (mine->filename_type == FNT_MBS)
		archive_set_error(a, errno, "Error seeking in '%s'",
		    mine->filename.m);
	else
		archive_set_error(a, errno, "Error seeking in '%ls'",
		    mine->filename.w);
	return (ARCHIVE_FATAL);
}